

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocmat.cpp
# Opt level: O3

int __thiscall TPZPostProcVar::ClassId(TPZPostProcVar *this)

{
  int32_t iVar1;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"TPZPostProcVar","");
  iVar1 = Hash(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

void TPZPostProcMat::SetPostProcessVarIndexList(TPZVec<std::string> & varIndexNames, TPZMaterial * pRefMat)
{
	if(!pRefMat)
	{
		PZError << "Error at " << __PRETTY_FUNCTION__ << " TPZPostProcMat::SetPostProcessVarIndexList() without valid reference material to post process\n";
		return;
	}
	
	int64_t i, n = varIndexNames.NElements(), k = 0;
	int varindex;
	fVars.Resize(n);
	
	for(i = 0; i < n; i++)
	{
		varindex = pRefMat->VariableIndex(varIndexNames[i]);
		if(varindex >= 0)
		{
			fVars[k].fIndex = varindex;
			fVars[k].fNumEq = pRefMat->NSolutionVariables(varindex);
			fVars[k].fName  = varIndexNames[i];
			k++;
		}
	}
    
	fVars.Resize(k);
	fDimension = pRefMat->Dimension();
	
}